

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

BrokerObject * helics::getBrokerObject(HelicsBroker broker,HelicsError *err)

{
  HelicsError *in_RSI;
  BrokerObject *in_RDI;
  BrokerObject *brokerObj;
  BrokerObject *local_8;
  
  if ((in_RSI == (HelicsError *)0x0) || (in_RSI->error_code == 0)) {
    if (in_RDI == (BrokerObject *)0x0) {
      assignError(in_RSI,-3,"broker object is not valid");
      local_8 = (BrokerObject *)0x0;
    }
    else {
      local_8 = in_RDI;
      if (in_RDI->valid != -0x5cb982e0) {
        assignError(in_RSI,-3,"broker object is not valid");
        local_8 = (BrokerObject *)0x0;
      }
    }
  }
  else {
    local_8 = (BrokerObject *)0x0;
  }
  return local_8;
}

Assistant:

BrokerObject* getBrokerObject(HelicsBroker broker, HelicsError* err) noexcept
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (broker == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidBrokerString);
        return nullptr;
    }
    auto* brokerObj = reinterpret_cast<helics::BrokerObject*>(broker);
    if (brokerObj->valid == gBrokerValidationIdentifier) {
        return brokerObj;
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidBrokerString);
    return nullptr;
}